

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O3

int __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
::remove(Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
         *this,char *__filename)

{
  int iVar1;
  undefined4 extraout_var;
  Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
  *pNVar2;
  long in_RDX;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *__filename_00;
  long lVar7;
  bool bVar8;
  
  lVar7 = (this->_value).second.micros;
  lVar3 = (long)(this->_value).second.days + lVar7 / 86400000000;
  lVar5 = lVar3 % 0x1e;
  lVar6 = (long)(this->_value).second.months + lVar3 / 0x1e;
  lVar4 = (long)*(int *)(in_RDX + 0xc) + *(long *)(in_RDX + 0x10) / 86400000000;
  lVar3 = lVar4 % 0x1e;
  lVar4 = (long)*(int *)(in_RDX + 8) + lVar4 / 0x1e;
  if (lVar6 <= lVar4) {
    if (lVar6 < lVar4) {
      if (__filename == (char *)0xffffffffffffffff) {
        return 0;
      }
    }
    else if ((lVar3 < lVar5) ||
            (__filename == (char *)0xffffffffffffffff ||
             *(long *)(in_RDX + 0x10) % 86400000000 < lVar7 % 86400000000 && lVar3 <= lVar5))
    goto LAB_004f4553;
    lVar7 = (long)__filename << 4;
    __filename_00 = __filename;
    do {
      pNVar2 = *(Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                 **)((long)&((this->_nodeRefs)._nodes.
                             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->pNode + lVar7);
      if (pNVar2 != (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                     *)0x0) {
        iVar1 = remove(pNVar2,__filename_00);
        if ((Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
             *)CONCAT44(extraout_var,iVar1) !=
            (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
             *)0x0) {
          pNVar2 = _adjRemoveRefs(this,(size_t)__filename_00,
                                  (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                                   *)CONCAT44(extraout_var,iVar1));
          return (int)pNVar2;
        }
      }
      lVar7 = lVar7 + -0x10;
      bVar8 = __filename_00 != (char *)0x0;
      __filename_00 = __filename_00 + -1;
    } while (bVar8);
  }
LAB_004f4553:
  if (__filename != (char *)0x0) {
    return 0;
  }
  lVar7 = (this->_value).second.micros;
  lVar4 = (long)(this->_value).second.days + lVar7 / 86400000000;
  lVar3 = (long)*(int *)(in_RDX + 0xc) + *(long *)(in_RDX + 0x10) / 86400000000;
  if ((long)(this->_value).second.months + lVar4 / 0x1e != (long)*(int *)(in_RDX + 8) + lVar3 / 0x1e
     ) {
    return 0;
  }
  lVar4 = lVar4 % 0x1e;
  lVar3 = lVar3 % 0x1e;
  if (lVar3 < lVar4) {
    return 0;
  }
  if (lVar3 <= lVar4) {
    if (*(long *)(in_RDX + 0x10) % 86400000000 == lVar7 % 86400000000) {
      (this->_nodeRefs)._swapLevel = 0;
      return (int)this;
    }
    return 0;
  }
  return 0;
}

Assistant:

Node<T, _Compare> *Node<T, _Compare>::remove(size_t call_level,
                         const T &value) {
    assert(_nodeRefs.height());
    assert(_nodeRefs.noNodePointerMatches(this));

    Node<T, _Compare> *pNode = nullptr;
    // Effectively: if (value >= _value) {
    if (!_compare(value, _value)) {
        for (size_t level = call_level + 1; level-- > 0;) {
            if (_nodeRefs[level].pNode) {
                // Make progress to the right
                pNode = _nodeRefs[level].pNode->remove(level, value);
                if (pNode) {
                    return _adjRemoveRefs(level, pNode);
                }
            }
            // Make progress down
        }
    }
    if (! pNode) { // Base case
        // We only admit to being the node to remove if the caller is
        // approaching us from level 0. It is entirely likely that
        // the same (or an other) caller can see us at a higher level
        // but the recursion stack will not have been set up in the correct
        // step wise fashion so that the lower level references will
        // not be swapped.
        // Effectively: if (call_level == 0 && value == _value) {
        if (call_level == 0 && !_compare(value, _value) && !_compare(_value, value)) {
            _nodeRefs.resetSwapLevel();
            return this;
        }
    }
    assert(pNode == nullptr);
    return nullptr;
}